

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenAtomicLoad(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,BinaryenType type,
                  BinaryenExpressionRef ptr,char *memoryName)

{
  Load *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (Load *)MixedArena::allocSpace(&module->allocator,0x48,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
  this->isAtomic = false;
  this->bytes = (uint8_t)bytes;
  this->signed_ = false;
  (this->offset).addr = (ulong)offset;
  (this->align).addr = (ulong)bytes;
  this->ptr = ptr;
  (this->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = type;
  (this->memory).super_IString.str = sVar1;
  wasm::Load::finalize(this);
  this->isAtomic = true;
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicLoad(BinaryenModuleRef module,
                                         uint32_t bytes,
                                         uint32_t offset,
                                         BinaryenType type,
                                         BinaryenExpressionRef ptr,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicLoad(bytes,
                      offset,
                      (Expression*)ptr,
                      Type(type),
                      getMemoryName(module, memoryName)));
}